

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_line_style.cxx
# Opt level: O0

void __thiscall
Fl_Graphics_Driver::line_style(Fl_Graphics_Driver *this,int style,int width,char *dashes)

{
  size_t sVar1;
  int local_54;
  int local_50;
  int local_44;
  char *local_40;
  char *p;
  char gap;
  char dot;
  char dash;
  int w;
  undefined1 uStack_24;
  char buf [7];
  int ndashes;
  char *dashes_local;
  int width_local;
  int style_local;
  Fl_Graphics_Driver *this_local;
  
  if (width == 0) {
    fl_line_width_ = 1;
  }
  else {
    local_44 = width;
    if (width < 1) {
      local_44 = -width;
    }
    fl_line_width_ = local_44;
  }
  unique0x10000148 = dashes;
  if (dashes == (char *)0x0) {
    local_50 = 0;
  }
  else {
    sVar1 = strlen(dashes);
    local_50 = (int)sVar1;
  }
  _uStack_24 = local_50;
  if ((local_50 == 0) && ((style & 0xffU) != 0)) {
    local_54 = width;
    if (width == 0) {
      local_54 = 1;
    }
    if ((style & 0x200U) == 0) {
      p._5_1_ = (char)local_54;
      p._7_1_ = p._5_1_ * '\x03';
      p._6_1_ = p._5_1_;
    }
    else {
      p._7_1_ = (char)(local_54 << 1);
      p._6_1_ = '\x01';
      p._5_1_ = (char)(local_54 << 1) + -1;
    }
    unique0x00004780 = &gap;
    local_40 = unique0x00004780;
    switch(style & 0xff) {
    case 1:
      gap = p._7_1_;
      local_40 = &dash;
      dot = p._5_1_;
      break;
    case 2:
      gap = p._6_1_;
      local_40 = &dash;
      dot = p._5_1_;
      break;
    case 3:
      gap = p._7_1_;
      dot = p._5_1_;
      dash = p._6_1_;
      local_40 = (char *)((long)&w + 1);
      w._0_1_ = p._5_1_;
      break;
    case 4:
      gap = p._7_1_;
      dot = p._5_1_;
      dash = p._6_1_;
      w._0_1_ = p._5_1_;
      w._1_1_ = p._6_1_;
      local_40 = (char *)((long)&w + 3);
      w._2_1_ = p._5_1_;
    }
    _uStack_24 = (int)local_40 - (int)&gap;
  }
  XSetLineAttributes(fl_display,fl_gc,width,_uStack_24 != 0,line_style::Cap[(int)(style >> 8 & 3)],
                     line_style::Join[(int)(style >> 0xc & 3)]);
  if (_uStack_24 != 0) {
    XSetDashes(fl_display,fl_gc,0,stack0xffffffffffffffe0,_uStack_24);
  }
  return;
}

Assistant:

void Fl_Graphics_Driver::line_style(int style, int width, char* dashes) {

  // save line width in global variable for X11 clipping
  if (width == 0) fl_line_width_ = 1;
  else fl_line_width_ = width>0 ? width : -width;

#if defined(USE_X11)
  int ndashes = dashes ? strlen(dashes) : 0;
  // emulate the WIN32 dash patterns on X
  char buf[7];
  if (!ndashes && (style&0xff)) {
    int w = width ? width : 1;
    char dash, dot, gap;
    // adjust lengths to account for cap:
    if (style & 0x200) {
      dash = char(2*w);
      dot = 1; // unfortunately 0 does not work
      gap = char(2*w-1);
    } else {
      dash = char(3*w);
      dot = gap = char(w);
    }
    char* p = dashes = buf;
    switch (style & 0xff) {
    case FL_DASH:	*p++ = dash; *p++ = gap; break;
    case FL_DOT:	*p++ = dot; *p++ = gap; break;
    case FL_DASHDOT:	*p++ = dash; *p++ = gap; *p++ = dot; *p++ = gap; break;
    case FL_DASHDOTDOT: *p++ = dash; *p++ = gap; *p++ = dot; *p++ = gap; *p++ = dot; *p++ = gap; break;
    }
    ndashes = p-buf;
  }
  static int Cap[4] = {CapButt, CapButt, CapRound, CapProjecting};
  static int Join[4] = {JoinMiter, JoinMiter, JoinRound, JoinBevel};
  XSetLineAttributes(fl_display, fl_gc, width, 
		     ndashes ? LineOnOffDash : LineSolid,
		     Cap[(style>>8)&3], Join[(style>>12)&3]);
  if (ndashes) XSetDashes(fl_display, fl_gc, 0, dashes, ndashes);
#elif defined(WIN32)
  // According to Bill, the "default" cap and join should be the
  // "fastest" mode supported for the platform.  I don't know why
  // they should be different (same graphics cards, etc., right?) MRS
  static DWORD Cap[4]= {PS_ENDCAP_FLAT, PS_ENDCAP_FLAT, PS_ENDCAP_ROUND, PS_ENDCAP_SQUARE};
  static DWORD Join[4]={PS_JOIN_ROUND, PS_JOIN_MITER, PS_JOIN_ROUND, PS_JOIN_BEVEL};
  int s1 = PS_GEOMETRIC | Cap[(style>>8)&3] | Join[(style>>12)&3];
  DWORD a[16]; int n = 0;
  if (dashes && dashes[0]) {
    s1 |= PS_USERSTYLE;
    for (n = 0; n < 16 && *dashes; n++) a[n] = *dashes++;
  } else {
    s1 |= style & 0xff; // allow them to pass any low 8 bits for style
  }
  if ((style || n) && !width) width = 1; // fix cards that do nothing for 0?
  LOGBRUSH penbrush = {BS_SOLID,fl_RGB(),0}; // can this be fl_brush()?
  HPEN newpen = ExtCreatePen(s1, width, &penbrush, n, n ? a : 0);
  if (!newpen) {
    Fl::error("fl_line_style(): Could not create GDI pen object.");
    return;
  }
  HPEN oldpen = (HPEN)SelectObject(fl_gc, newpen);
  DeleteObject(oldpen);
  DeleteObject(fl_current_xmap->pen);
  fl_current_xmap->pen = newpen;
#elif defined(__APPLE_QUARTZ__)
  static /*enum*/ CGLineCap Cap[4] = { kCGLineCapButt, kCGLineCapButt,
                                   kCGLineCapRound, kCGLineCapSquare };
  static /*enum*/ CGLineJoin Join[4] = { kCGLineJoinMiter, kCGLineJoinMiter, 
                                    kCGLineJoinRound, kCGLineJoinBevel };
  if (width<1) width = 1;
  fl_quartz_line_width_ = (float)width; 
  fl_quartz_line_cap_ = Cap[(style>>8)&3];
  // when printing kCGLineCapSquare seems better for solid lines
  if ( Fl_Surface_Device::surface() != Fl_Display_Device::display_device() && style == FL_SOLID && dashes == NULL ) {
    fl_quartz_line_cap_ = kCGLineCapSquare;
    }
  fl_quartz_line_join_ = Join[(style>>12)&3];
  char *d = dashes; 
  static CGFloat pattern[16];
  if (d && *d) {
	CGFloat *p = pattern;
    while (*d) { *p++ = (float)*d++; }
    fl_quartz_line_pattern = pattern;
    fl_quartz_line_pattern_size = d-dashes;
  } else if (style & 0xff) {
    char dash, dot, gap;
    // adjust lengths to account for cap:
    if (style & 0x200) {
      dash = char(2*width);
      dot = 1; 
      gap = char(2*width-1);
    } else {
      dash = char(3*width);
      dot = gap = char(width);
    }
	CGFloat *p = pattern;
    switch (style & 0xff) {
    case FL_DASH:       *p++ = dash; *p++ = gap; break;
    case FL_DOT:        *p++ = dot; *p++ = gap; break;
    case FL_DASHDOT:    *p++ = dash; *p++ = gap; *p++ = dot; *p++ = gap; break;
    case FL_DASHDOTDOT: *p++ = dash; *p++ = gap; *p++ = dot; *p++ = gap; *p++ = dot; *p++ = gap; break;
    }
    fl_quartz_line_pattern_size = p-pattern;
    fl_quartz_line_pattern = pattern;
  } else {
    fl_quartz_line_pattern = 0; 
		fl_quartz_line_pattern_size = 0;
  }
  fl_quartz_restore_line_style_();
#else
# error unsupported platform
#endif
}